

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_SMC(DisasContext_conflict1 *s,arg_SMC *a)

{
  int iVar1;
  arg_SMC *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,4);
  if ((iVar1 != 0) && (iVar1 = arm_dc_feature(s,9), iVar1 == 0)) {
    if (s->user == 0) {
      gen_smc(s);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
    return true;
  }
  return false;
}

Assistant:

static bool trans_SMC(DisasContext *s, arg_SMC *a)
{
    if (!ENABLE_ARCH_6K || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
    } else {
        gen_smc(s);
    }
    return true;
}